

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTables.h
# Opt level: O0

void __thiscall CTables::calcOrientationTable(CTables *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int **ppiVar5;
  double **ppdVar6;
  int *piVar7;
  double *pdVar8;
  ostream *this_00;
  float fVar9;
  double dVar10;
  int local_28;
  int local_24;
  int x;
  int y;
  double intervalHalf;
  double intervalFull;
  CTables *this_local;
  
  ppiVar5 = (int **)operator_new__(0xff8);
  this->orientationFullTable = ppiVar5;
  ppiVar5 = (int **)operator_new__(0xff8);
  this->orientationHalfTable = ppiVar5;
  ppdVar6 = (double **)operator_new__(0xff8);
  this->magnitudeTable = ppdVar6;
  iVar1 = this->oriFull;
  iVar2 = this->numOriFull;
  iVar3 = this->oriHalf;
  iVar4 = this->numOriHalf;
  for (local_24 = -0xff; local_24 < 0x100; local_24 = local_24 + 1) {
    piVar7 = (int *)operator_new__(0x7fc);
    this->orientationFullTable[local_24 + 0xff] = piVar7;
    piVar7 = (int *)operator_new__(0x7fc);
    this->orientationHalfTable[local_24 + 0xff] = piVar7;
    pdVar8 = (double *)operator_new__(0xff8);
    this->magnitudeTable[local_24 + 0xff] = pdVar8;
    for (local_28 = -0xff; local_28 < 0x100; local_28 = local_28 + 1) {
      dVar10 = arcTan(this,(double)local_28,(double)local_24);
      this->orientationFullTable[local_24 + 0xff][local_28 + 0xff] =
           (int)((double)(((int)dVar10 + 0x168) % this->oriFull) / (double)(iVar1 / iVar2));
      dVar10 = arcTan(this,(double)local_28,(double)local_24);
      this->orientationHalfTable[local_24 + 0xff][local_28 + 0xff] =
           (int)((double)(((int)dVar10 + 0x168) % this->oriHalf) / (double)(iVar3 / iVar4));
      fVar9 = sqrtf((float)(local_28 * local_28 + local_24 * local_24));
      this->magnitudeTable[local_24 + 0xff][local_28 + 0xff] = (double)fVar9;
    }
  }
  this_00 = std::operator<<((ostream *)&std::cout,"ori and magn table created");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void CTables::calcOrientationTable()
{
    orientationFullTable = new int*[NUM_DIFF];
    orientationHalfTable = new int*[NUM_DIFF];
    magnitudeTable = new double*[NUM_DIFF];
    double intervalFull = oriFull/numOriFull;
    double intervalHalf = oriHalf/numOriHalf;
    for(int y=-255; y<=255; y++)
    {
        orientationFullTable[y+255] = new int[NUM_DIFF];
        orientationHalfTable[y+255] = new int[NUM_DIFF];
        magnitudeTable[y+255] = new double[NUM_DIFF];
        for(int x=-255; x<=255; x++)
        {
            orientationFullTable[y+255][x+255] = (((int)arcTan(x, y)+360)%oriFull)/intervalFull;
            orientationHalfTable[y+255][x+255] = (((int)arcTan(x, y)+360)%oriHalf)/intervalHalf;
            magnitudeTable[y+255][x+255] = sqrtf(x*x + y*y);
        }
    }
    cout<<"ori and magn table created"<<endl;
}